

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::LongNameHandler::processQuantity
          (LongNameHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  Form FVar1;
  undefined1 local_78 [8];
  DecimalQuantity copy;
  UErrorCode *status_local;
  MicroProps *micros_local;
  DecimalQuantity *quantity_local;
  LongNameHandler *this_local;
  
  copy._72_8_ = status;
  (*this->parent->_vptr_MicroPropsGenerator[2])(this->parent,quantity,micros,status);
  DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_78,quantity);
  RoundingImpl::apply(&micros->rounder,(DecimalQuantity *)local_78,(UErrorCode *)copy._72_8_);
  FVar1 = utils::getStandardPlural(this->rules,(IFixedDecimal *)local_78);
  micros->modOuter = (Modifier *)(&this->field_0x10 + (ulong)FVar1 * 0x70);
  DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_78);
  return;
}

Assistant:

void LongNameHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                      UErrorCode &status) const {
    parent->processQuantity(quantity, micros, status);
    // TODO: Avoid the copy here?
    DecimalQuantity copy(quantity);
    micros.rounder.apply(copy, status);
    micros.modOuter = &fModifiers[utils::getStandardPlural(rules, copy)];
}